

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::escape_ml_basic_string
          (serializer<toml::type_config> *this,string_type *s)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined8 in_RDX;
  size_type in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type found_3_quotes;
  int c2;
  int c1;
  char_type c;
  const_iterator __end0;
  const_iterator __begin0;
  string_type *__range3;
  string_type *retval;
  undefined7 in_stack_fffffffffffffde8;
  char in_stack_fffffffffffffdef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined8 local_28;
  undefined1 local_19;
  undefined8 local_18;
  
  local_19 = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  local_28 = local_18;
  local_30._M_current =
       (char *)CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
            (in_stack_fffffffffffffdf8);
  while (bVar2 = __gnu_cxx::
                 operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffdf0,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8)),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    cVar1 = *pcVar3;
    in_stack_fffffffffffffe04 = (int)cVar1;
    if (in_stack_fffffffffffffe04 == 8) {
      string_conv<std::__cxx11::string,3ul>
                ((char (*) [3])CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(in_stack_fffffffffffffdf0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      std::__cxx11::string::~string(in_stack_fffffffffffffdf0);
    }
    else if (in_stack_fffffffffffffe04 == 9) {
      string_conv<std::__cxx11::string,3ul>
                ((char (*) [3])CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(in_stack_fffffffffffffdf0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      std::__cxx11::string::~string(in_stack_fffffffffffffdf0);
    }
    else if (in_stack_fffffffffffffe04 == 10) {
      string_conv<std::__cxx11::string,2ul>
                ((char (*) [2])CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(in_stack_fffffffffffffdf0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      std::__cxx11::string::~string(in_stack_fffffffffffffdf0);
    }
    else if (in_stack_fffffffffffffe04 == 0xc) {
      string_conv<std::__cxx11::string,3ul>
                ((char (*) [3])CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(in_stack_fffffffffffffdf0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      std::__cxx11::string::~string(in_stack_fffffffffffffdf0);
    }
    else if (in_stack_fffffffffffffe04 == 0xd) {
      string_conv<std::__cxx11::string,3ul>
                ((char (*) [3])CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(in_stack_fffffffffffffdf0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      std::__cxx11::string::~string(in_stack_fffffffffffffdf0);
    }
    else if (in_stack_fffffffffffffe04 == 0x5c) {
      string_conv<std::__cxx11::string,3ul>
                ((char (*) [3])CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(in_stack_fffffffffffffdf0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      std::__cxx11::string::~string(in_stack_fffffffffffffdf0);
    }
    else if ((cVar1 == '\x1b') && ((*(byte *)(in_RSI + 0x10) & 1) != 0)) {
      string_conv<std::__cxx11::string,3ul>
                ((char (*) [3])CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(in_stack_fffffffffffffdf0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      std::__cxx11::string::~string(in_stack_fffffffffffffdf0);
    }
    else if (((cVar1 < '\0') || ('\b' < cVar1)) &&
            (((cVar1 < '\n' || ('\x1f' < cVar1)) && (cVar1 != '\x7f')))) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdef);
    }
    else {
      if ((*(byte *)(in_RSI + 0x11) & 1) == 0) {
        string_conv<std::__cxx11::string,5ul>
                  ((char (*) [5])CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(in_stack_fffffffffffffdf0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
        std::__cxx11::string::~string(in_stack_fffffffffffffdf0);
      }
      else {
        string_conv<std::__cxx11::string,3ul>
                  ((char (*) [3])CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(in_stack_fffffffffffffdf0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
        std::__cxx11::string::~string(in_stack_fffffffffffffdf0);
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdef);
      if ((int)cVar1 % 0x10 < 10) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdef);
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdef);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30);
  }
  string_conv<std::__cxx11::string,4ul>
            ((char (*) [4])CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find(this_00,in_RDI,CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  std::__cxx11::string::~string(in_stack_fffffffffffffdf0);
  while (local_180 !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
    string_conv<std::__cxx11::string,5ul>
              ((char (*) [5])CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (in_stack_fffffffffffffe20,in_RSI,(size_type)this_00,in_RDI);
    std::__cxx11::string::~string(local_180);
    string_conv<std::__cxx11::string,4ul>
              ((char (*) [4])CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find(this_00,in_RDI,CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    std::__cxx11::string::~string(local_180);
    local_180 = pbVar4;
  }
  return (string_type *)this_00;
}

Assistant:

string_type escape_ml_basic_string(const string_type& s) // {{{
    {
        string_type retval;
        for(const char_type c : s)
        {
            switch(c)
            {
                case char_type('\\'): {retval += string_conv<string_type>("\\\\"); break;}
                case char_type('\b'): {retval += string_conv<string_type>("\\b" ); break;}
                case char_type('\t'): {retval += string_conv<string_type>("\\t" ); break;}
                case char_type('\f'): {retval += string_conv<string_type>("\\f" ); break;}
                case char_type('\n'): {retval += string_conv<string_type>("\n"  ); break;}
                case char_type('\r'): {retval += string_conv<string_type>("\\r" ); break;}
                default  :
                {
                    if(c == char_type(0x1B) && spec_.v1_1_0_add_escape_sequence_e)
                    {
                        retval += string_conv<string_type>("\\e");
                    }
                    else if((char_type(0x00) <= c && c <= char_type(0x08)) ||
                            (char_type(0x0A) <= c && c <= char_type(0x1F)) ||
                            c == char_type(0x7F))
                    {
                        if(spec_.v1_1_0_add_escape_sequence_x)
                        {
                            retval += string_conv<string_type>("\\x");
                        }
                        else
                        {
                            retval += string_conv<string_type>("\\u00");
                        }
                        const auto c1 = c / 16;
                        const auto c2 = c % 16;
                        retval += static_cast<char_type>('0' + c1);
                        if(c2 < 10)
                        {
                            retval += static_cast<char_type>('0' + c2);
                        }
                        else // 10 <= c2
                        {
                            retval += static_cast<char_type>('A' + (c2 - 10));
                        }
                    }
                    else
                    {
                        retval += c;
                    }
                }
            }
        }
        // Only 1 or 2 consecutive `"`s are allowed in multiline basic string.
        // 3 consecutive `"`s are considered as a closing delimiter.
        // We need to check if there are 3 or more consecutive `"`s and insert
        // backslash to break them down into several short `"`s like the `str6`
        // in the following example.
        // ```toml
        // str4 = """Here are two quotation marks: "". Simple enough."""
        // # str5 = """Here are three quotation marks: """."""  # INVALID
        // str5 = """Here are three quotation marks: ""\"."""
        // str6 = """Here are fifteen quotation marks: ""\"""\"""\"""\"""\"."""
        // ```
        auto found_3_quotes = retval.find(string_conv<string_type>("\"\"\""));
        while(found_3_quotes != string_type::npos)
        {
            retval.replace(found_3_quotes, 3, string_conv<string_type>("\"\"\\\""));
            found_3_quotes = retval.find(string_conv<string_type>("\"\"\""));
        }
        return retval;
    }